

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::V1LayerParameter::InternalSerializeWithCachedSizesToArray
          (V1LayerParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  char *pcVar2;
  string *psVar3;
  Type *pTVar4;
  Type *value;
  uint8 *puVar5;
  Type *pTVar6;
  UnknownFieldSet *unknown_fields;
  int iVar7;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar8;
  int iVar9;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 2) != 0) {
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::V0LayerParameter>
                       (1,this->layer_,deterministic,target);
  }
  iVar7 = (this->bottom_).super_RepeatedPtrFieldBase.current_size_;
  iVar9 = 0;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  pRVar8 = &this->bottom_;
  for (; iVar7 != iVar9; iVar9 = iVar9 + 1) {
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar8->super_RepeatedPtrFieldBase,iVar9);
    pcVar2 = (pTVar4->_M_dataplus)._M_p;
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar8->super_RepeatedPtrFieldBase,iVar9);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar2,(int)pTVar4->_M_string_length,SERIALIZE,"caffe.V1LayerParameter.bottom");
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar8->super_RepeatedPtrFieldBase,iVar9);
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray(2,pTVar4,target);
  }
  iVar7 = (this->top_).super_RepeatedPtrFieldBase.current_size_;
  iVar9 = 0;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  pRVar8 = &this->top_;
  for (; iVar7 != iVar9; iVar9 = iVar9 + 1) {
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar8->super_RepeatedPtrFieldBase,iVar9);
    pcVar2 = (pTVar4->_M_dataplus)._M_p;
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar8->super_RepeatedPtrFieldBase,iVar9);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar2,(int)pTVar4->_M_string_length,SERIALIZE,"caffe.V1LayerParameter.top");
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar8->super_RepeatedPtrFieldBase,iVar9);
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray(3,pTVar4,target);
  }
  if ((uVar1 & 1) != 0) {
    psVar3 = (this->name_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.V1LayerParameter.name");
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (4,(this->name_).ptr_,target);
  }
  if (((this->_has_bits_).has_bits_[1] & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray(5,this->type_,target);
  }
  iVar7 = (this->blobs_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar9 = 0; iVar7 != iVar9; iVar9 = iVar9 + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                      (&(this->blobs_).super_RepeatedPtrFieldBase,iVar9);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::BlobProto>(6,value,deterministic,target);
  }
  puVar5 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(7,&this->blobs_lr_,target);
  puVar5 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                     (8,&this->weight_decay_,puVar5);
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 4) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ConcatParameter>
                       (9,this->concat_param_,deterministic,puVar5);
  }
  if ((uVar1 & 8) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ConvolutionParameter>
                       (10,this->convolution_param_,deterministic,puVar5);
  }
  if ((uVar1 & 0x10) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::DataParameter>
                       (0xb,this->data_param_,deterministic,puVar5);
  }
  if ((uVar1 & 0x20) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::DropoutParameter>
                       (0xc,this->dropout_param_,deterministic,puVar5);
  }
  if ((uVar1 & 0x40) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::HDF5DataParameter>
                       (0xd,this->hdf5_data_param_,deterministic,puVar5);
  }
  if ((char)uVar1 < '\0') {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::HDF5OutputParameter>
                       (0xe,this->hdf5_output_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ImageDataParameter>
                       (0xf,this->image_data_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 9 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::InfogainLossParameter>
                       (0x10,this->infogain_loss_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 10 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::InnerProductParameter>
                       (0x11,this->inner_product_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::LRNParameter>
                       (0x12,this->lrn_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::PoolingParameter>
                       (0x13,this->pooling_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::WindowDataParameter>
                       (0x14,this->window_data_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::PowerParameter>
                       (0x15,this->power_param_,deterministic,puVar5);
  }
  if ((short)uVar1 < 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::MemoryDataParameter>
                       (0x16,this->memory_data_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ArgMaxParameter>
                       (0x17,this->argmax_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x11 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::EltwiseParameter>
                       (0x18,this->eltwise_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x12 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ThresholdParameter>
                       (0x19,this->threshold_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x13 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::DummyDataParameter>
                       (0x1a,this->dummy_data_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x14 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::AccuracyParameter>
                       (0x1b,this->accuracy_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x15 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::HingeLossParameter>
                       (0x1d,this->hinge_loss_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x16 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ReLUParameter>
                       (0x1e,this->relu_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x17 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::SliceParameter>
                       (0x1f,this->slice_param_,deterministic,puVar5);
  }
  iVar7 = (this->include_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar9 = 0; iVar7 != iVar9; iVar9 = iVar9 + 1) {
    pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
                       (&(this->include_).super_RepeatedPtrFieldBase,iVar9);
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::NetStateRule>
                       (0x20,pTVar6,deterministic,puVar5);
  }
  iVar7 = (this->exclude_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar9 = 0; iVar7 != iVar9; iVar9 = iVar9 + 1) {
    pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
                       (&(this->exclude_).super_RepeatedPtrFieldBase,iVar9);
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::NetStateRule>
                       (0x21,pTVar6,deterministic,puVar5);
  }
  if ((uVar1 >> 0x18 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::MVNParameter>
                       (0x22,this->mvn_param_,deterministic,puVar5);
  }
  puVar5 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                     (0x23,&this->loss_weight_,puVar5);
  if ((uVar1 >> 0x19 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::TransformationParameter>
                       (0x24,this->transform_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x1a & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::TanHParameter>
                       (0x25,this->tanh_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x1b & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::SigmoidParameter>
                       (0x26,this->sigmoid_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x1c & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::SoftmaxParameter>
                       (0x27,this->softmax_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x1d & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ContrastiveLossParameter>
                       (0x28,this->contrastive_loss_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x1e & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ExpParameter>
                       (0x29,this->exp_param_,deterministic,puVar5);
  }
  if ((int)uVar1 < 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::LossParameter>
                       (0x2a,this->loss_param_,deterministic,puVar5);
  }
  iVar7 = (this->param_).super_RepeatedPtrFieldBase.current_size_;
  pRVar8 = &this->param_;
  iVar9 = 0;
  if (iVar7 < 1) {
    iVar7 = iVar9;
  }
  for (; iVar7 != iVar9; iVar9 = iVar9 + 1) {
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar8->super_RepeatedPtrFieldBase,iVar9);
    pcVar2 = (pTVar4->_M_dataplus)._M_p;
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar8->super_RepeatedPtrFieldBase,iVar9);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar2,(int)pTVar4->_M_string_length,SERIALIZE,"caffe.V1LayerParameter.param");
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar8->super_RepeatedPtrFieldBase,iVar9);
    puVar5 = google::protobuf::internal::WireFormatLite::WriteStringToArray(0x3e9,pTVar4,puVar5);
  }
  puVar5 = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                     (0x3ea,&this->blob_share_mode_,puVar5);
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    unknown_fields = V1LayerParameter::unknown_fields(this);
    puVar5 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       (unknown_fields,puVar5);
    return puVar5;
  }
  return puVar5;
}

Assistant:

::google::protobuf::uint8* V1LayerParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.V1LayerParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.V0LayerParameter layer = 1;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1, *this->layer_, deterministic, target);
  }

  // repeated string bottom = 2;
  for (int i = 0, n = this->bottom_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->bottom(i).data(), this->bottom(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.bottom");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(2, this->bottom(i), target);
  }

  // repeated string top = 3;
  for (int i = 0, n = this->top_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->top(i).data(), this->top(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.top");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->top(i), target);
  }

  // optional string name = 4;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        4, this->name(), target);
  }

  cached_has_bits = _has_bits_[1];
  // optional .caffe.V1LayerParameter.LayerType type = 5;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      5, this->type(), target);
  }

  // repeated .caffe.BlobProto blobs = 6;
  for (unsigned int i = 0, n = this->blobs_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, this->blobs(i), deterministic, target);
  }

  // repeated float blobs_lr = 7;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(7, this->blobs_lr_, target);

  // repeated float weight_decay = 8;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(8, this->weight_decay_, target);

  cached_has_bits = _has_bits_[0];
  // optional .caffe.ConcatParameter concat_param = 9;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        9, *this->concat_param_, deterministic, target);
  }

  // optional .caffe.ConvolutionParameter convolution_param = 10;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        10, *this->convolution_param_, deterministic, target);
  }

  // optional .caffe.DataParameter data_param = 11;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        11, *this->data_param_, deterministic, target);
  }

  // optional .caffe.DropoutParameter dropout_param = 12;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        12, *this->dropout_param_, deterministic, target);
  }

  // optional .caffe.HDF5DataParameter hdf5_data_param = 13;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        13, *this->hdf5_data_param_, deterministic, target);
  }

  // optional .caffe.HDF5OutputParameter hdf5_output_param = 14;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        14, *this->hdf5_output_param_, deterministic, target);
  }

  // optional .caffe.ImageDataParameter image_data_param = 15;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        15, *this->image_data_param_, deterministic, target);
  }

  // optional .caffe.InfogainLossParameter infogain_loss_param = 16;
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        16, *this->infogain_loss_param_, deterministic, target);
  }

  // optional .caffe.InnerProductParameter inner_product_param = 17;
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        17, *this->inner_product_param_, deterministic, target);
  }

  // optional .caffe.LRNParameter lrn_param = 18;
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        18, *this->lrn_param_, deterministic, target);
  }

  // optional .caffe.PoolingParameter pooling_param = 19;
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        19, *this->pooling_param_, deterministic, target);
  }

  // optional .caffe.WindowDataParameter window_data_param = 20;
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        20, *this->window_data_param_, deterministic, target);
  }

  // optional .caffe.PowerParameter power_param = 21;
  if (cached_has_bits & 0x00004000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        21, *this->power_param_, deterministic, target);
  }

  // optional .caffe.MemoryDataParameter memory_data_param = 22;
  if (cached_has_bits & 0x00008000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        22, *this->memory_data_param_, deterministic, target);
  }

  // optional .caffe.ArgMaxParameter argmax_param = 23;
  if (cached_has_bits & 0x00010000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        23, *this->argmax_param_, deterministic, target);
  }

  // optional .caffe.EltwiseParameter eltwise_param = 24;
  if (cached_has_bits & 0x00020000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        24, *this->eltwise_param_, deterministic, target);
  }

  // optional .caffe.ThresholdParameter threshold_param = 25;
  if (cached_has_bits & 0x00040000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        25, *this->threshold_param_, deterministic, target);
  }

  // optional .caffe.DummyDataParameter dummy_data_param = 26;
  if (cached_has_bits & 0x00080000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        26, *this->dummy_data_param_, deterministic, target);
  }

  // optional .caffe.AccuracyParameter accuracy_param = 27;
  if (cached_has_bits & 0x00100000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        27, *this->accuracy_param_, deterministic, target);
  }

  // optional .caffe.HingeLossParameter hinge_loss_param = 29;
  if (cached_has_bits & 0x00200000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        29, *this->hinge_loss_param_, deterministic, target);
  }

  // optional .caffe.ReLUParameter relu_param = 30;
  if (cached_has_bits & 0x00400000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        30, *this->relu_param_, deterministic, target);
  }

  // optional .caffe.SliceParameter slice_param = 31;
  if (cached_has_bits & 0x00800000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        31, *this->slice_param_, deterministic, target);
  }

  // repeated .caffe.NetStateRule include = 32;
  for (unsigned int i = 0, n = this->include_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        32, this->include(i), deterministic, target);
  }

  // repeated .caffe.NetStateRule exclude = 33;
  for (unsigned int i = 0, n = this->exclude_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        33, this->exclude(i), deterministic, target);
  }

  // optional .caffe.MVNParameter mvn_param = 34;
  if (cached_has_bits & 0x01000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        34, *this->mvn_param_, deterministic, target);
  }

  // repeated float loss_weight = 35;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(35, this->loss_weight_, target);

  // optional .caffe.TransformationParameter transform_param = 36;
  if (cached_has_bits & 0x02000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        36, *this->transform_param_, deterministic, target);
  }

  // optional .caffe.TanHParameter tanh_param = 37;
  if (cached_has_bits & 0x04000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        37, *this->tanh_param_, deterministic, target);
  }

  // optional .caffe.SigmoidParameter sigmoid_param = 38;
  if (cached_has_bits & 0x08000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        38, *this->sigmoid_param_, deterministic, target);
  }

  // optional .caffe.SoftmaxParameter softmax_param = 39;
  if (cached_has_bits & 0x10000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        39, *this->softmax_param_, deterministic, target);
  }

  // optional .caffe.ContrastiveLossParameter contrastive_loss_param = 40;
  if (cached_has_bits & 0x20000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        40, *this->contrastive_loss_param_, deterministic, target);
  }

  // optional .caffe.ExpParameter exp_param = 41;
  if (cached_has_bits & 0x40000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        41, *this->exp_param_, deterministic, target);
  }

  // optional .caffe.LossParameter loss_param = 42;
  if (cached_has_bits & 0x80000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        42, *this->loss_param_, deterministic, target);
  }

  // repeated string param = 1001;
  for (int i = 0, n = this->param_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->param(i).data(), this->param(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V1LayerParameter.param");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(1001, this->param(i), target);
  }

  // repeated .caffe.V1LayerParameter.DimCheckMode blob_share_mode = 1002;
  target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
    1002, this->blob_share_mode_, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.V1LayerParameter)
  return target;
}